

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_bn_sx_sy_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,blend_unit_fn blend)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  uint16_t *puVar5;
  undefined4 in_register_0000008c;
  longlong lVar6;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i alVar12;
  __m128i alVar13;
  long lVar4;
  
  lVar6 = CONCAT44(in_register_0000008c,src1_stride);
  lVar4 = (ulong)src1_stride * 2;
  lVar3 = (ulong)src0_stride * 2;
  puVar5 = src1;
  do {
    uVar1 = *(undefined8 *)mask;
    uVar2 = *(undefined8 *)(mask + mask_stride);
    auVar8[0] = (char)uVar2 + (char)uVar1;
    auVar8[1] = (char)((ulong)uVar2 >> 8) + (char)((ulong)uVar1 >> 8);
    auVar8[2] = (char)((ulong)uVar2 >> 0x10) + (char)((ulong)uVar1 >> 0x10);
    auVar8[3] = (char)((ulong)uVar2 >> 0x18) + (char)((ulong)uVar1 >> 0x18);
    auVar8[4] = (char)((ulong)uVar2 >> 0x20) + (char)((ulong)uVar1 >> 0x20);
    auVar8[5] = (char)((ulong)uVar2 >> 0x28) + (char)((ulong)uVar1 >> 0x28);
    auVar8[6] = (char)((ulong)uVar2 >> 0x30) + (char)((ulong)uVar1 >> 0x30);
    auVar8[7] = (char)((ulong)uVar2 >> 0x38) + (char)((ulong)uVar1 >> 0x38);
    auVar8._8_8_ = 0;
    auVar7 = pshufb(auVar8,_DAT_00468940);
    auVar8 = pshufb(auVar8,_DAT_00468c80);
    auVar11 = auVar8 & auVar7;
    auVar8 = auVar8 ^ auVar7;
    auVar9._0_2_ = auVar8._0_2_ >> 1;
    auVar9._2_2_ = auVar8._2_2_ >> 1;
    auVar9._4_2_ = auVar8._4_2_ >> 1;
    auVar9._6_2_ = auVar8._6_2_ >> 1;
    auVar9._8_2_ = auVar8._8_2_ >> 1;
    auVar9._10_2_ = auVar8._10_2_ >> 1;
    auVar9._12_2_ = auVar8._12_2_ >> 1;
    auVar9._14_2_ = auVar8._14_2_ >> 1;
    auVar9 = auVar9 & _DAT_00424050;
    auVar10[0] = auVar9[0] + auVar11[0];
    auVar10[1] = auVar9[1] + auVar11[1];
    auVar10[2] = auVar9[2] + auVar11[2];
    auVar10[3] = auVar9[3] + auVar11[3];
    auVar10[4] = auVar9[4] + auVar11[4];
    auVar10[5] = auVar9[5] + auVar11[5];
    auVar10[6] = auVar9[6] + auVar11[6];
    auVar10[7] = auVar9[7] + auVar11[7];
    auVar10[8] = auVar9[8] + auVar11[8];
    auVar10[9] = auVar9[9] + auVar11[9];
    auVar10[10] = auVar9[10] + auVar11[10];
    auVar10[0xb] = auVar9[0xb] + auVar11[0xb];
    auVar10[0xc] = auVar9[0xc] + auVar11[0xc];
    auVar10[0xd] = auVar9[0xd] + auVar11[0xd];
    auVar10[0xe] = auVar9[0xe] + auVar11[0xe];
    auVar10[0xf] = auVar9[0xf] + auVar11[0xf];
    auVar7 = pmovzxbw(auVar7,auVar10);
    pavgw(auVar7._0_2_,0);
    pavgw(auVar7._2_2_,0);
    pavgw(auVar7._4_2_,0);
    pavgw(auVar7._6_2_,0);
    pavgw(auVar7._8_2_,0);
    pavgw(auVar7._10_2_,0);
    pavgw(auVar7._12_2_,0);
    pavgw(auVar7._14_2_,0);
    pmovsxbw(auVar10,0x4040404040404040);
    alVar12[1] = lVar3;
    alVar12[0] = lVar4;
    alVar13[1] = lVar6;
    alVar13[0] = (longlong)puVar5;
    alVar12 = (*blend)(src0,src1,alVar12,alVar13);
    lVar4 = alVar12[1];
    *(undefined8 *)dst = extraout_XMM0_Qa;
    mask = mask + mask_stride * 2;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sx_sy_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, blend_unit_fn blend) {
  const __m128i v_zmask_b =
      _mm_set_epi8(0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1);
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    const __m128i v_ra_b = xx_loadl_64(mask);
    const __m128i v_rb_b = xx_loadl_64(mask + mask_stride);
    const __m128i v_rvs_b = _mm_add_epi8(v_ra_b, v_rb_b);
    const __m128i v_rvsa_w = _mm_and_si128(v_rvs_b, v_zmask_b);
    const __m128i v_rvsb_w =
        _mm_and_si128(_mm_srli_si128(v_rvs_b, 1), v_zmask_b);
    const __m128i v_rs_w = _mm_add_epi16(v_rvsa_w, v_rvsb_w);

    const __m128i v_m0_w = xx_roundn_epu16(v_rs_w, 2);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

    const __m128i v_res_w = blend(src0, src1, v_m0_w, v_m1_w);

    xx_storel_64(dst, v_res_w);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}